

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server-ws.c
# Opt level: O2

int lws_parse_ws(lws *wsi,uchar **buf,size_t len)

{
  byte bVar1;
  uint *buf_00;
  lws_callback_function *callback_function;
  uchar *puVar2;
  ulong uVar3;
  int iVar4;
  uint *puVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  char *buf_01;
  size_t len_00;
  undefined8 uVar9;
  _lws_websocket_related *p_Var10;
  uint uVar11;
  bool bVar12;
  size_t sStack_50;
  uint local_3c;
  uchar *local_38;
  
  local_38 = *buf;
  _lws_log(0x10,"%s: received %d byte packet\n","lws_parse_ws",len & 0xffffffff);
  do {
    if (len == 0) {
      _lws_log(0x10,"%s: exit with %d unused\n","lws_parse_ws",0);
      return 0;
    }
    if (wsi->rxflow_bitmap != '\0') {
      _lws_log(8,"%s: doing rxflow, caching %d\n","lws_parse_ws",len & 0xffffffff);
      iVar4 = lws_rxflow_cache(wsi,*buf,0,(int)len);
      if (iVar4 == 2) {
        _lws_log(8,"%s: trimming inside rxflow cache\n","lws_parse_ws");
      }
      else {
        local_38 = *buf + len;
      }
      *buf = local_38;
      return 1;
    }
    bVar12 = true;
    while (wsi->lws_rx_parse_state == '\x14') {
      p_Var10 = wsi->ws;
      if ((byte)(p_Var10->opcode - 1) < 2) {
        if (len == 0) {
          len = 0;
          break;
        }
      }
      else if ((p_Var10->opcode != '\0') || (len == 0)) break;
      uVar8 = wsi->protocol->rx_buffer_size;
      if (uVar8 == 0) {
        uVar8 = (ulong)wsi->context->pt_serv_buf_size;
      }
      buf_00 = (uint *)*buf;
      uVar3 = p_Var10->rx_packet_length;
      if ((uVar8 & 0xffffffff) <= p_Var10->rx_packet_length) {
        uVar3 = uVar8;
      }
      uVar11 = (uint)uVar3;
      if (len < (uVar3 & 0xffffffff)) {
        uVar11 = (uint)len;
      }
      if (uVar11 == 0) {
        uVar6 = 0;
      }
      else {
        if ((p_Var10->field_0x95 & 4) == 0) {
          bVar1 = p_Var10->mask_idx;
          for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
            *(uint8_t *)((long)&local_3c + lVar7) = p_Var10->mask[(uint)bVar1 + (int)lVar7 & 3];
          }
          uVar6 = uVar11 >> 2;
          puVar5 = buf_00;
          while (bVar12 = uVar6 != 0, uVar6 = uVar6 - 1, bVar12) {
            *puVar5 = *puVar5 ^ local_3c;
            puVar5 = puVar5 + 1;
          }
          for (uVar8 = 0; (uVar11 & 3) != uVar8; uVar8 = uVar8 + 1) {
            *(byte *)((long)puVar5 + uVar8) =
                 *(byte *)((long)puVar5 + uVar8) ^ *(byte *)((long)&local_3c + uVar8);
          }
          wsi->ws->mask_idx = wsi->ws->mask_idx + (char)uVar11 & 3;
          bVar12 = (ulong)(uVar11 & 3) != 0;
        }
        else {
          bVar12 = false;
        }
        _lws_log(8,"%s: using %d of raw input (total %d on offer)\n","lws_ws_frame_rest_is_payload",
                 (ulong)uVar11,len & 0xffffffff);
        *buf = *buf + uVar11;
        p_Var10 = wsi->ws;
        p_Var10->rx_packet_length = p_Var10->rx_packet_length - (ulong)uVar11;
        len_00 = (size_t)(int)uVar11;
        if ((*(ushort *)&p_Var10->field_0x95 & 0xc00) == 0x400) {
          iVar4 = lws_check_utf8(&p_Var10->utf8,(uchar *)buf_00,len_00);
          if (iVar4 == 0) {
            p_Var10 = wsi->ws;
            if (((p_Var10->rx_packet_length != 0) || ((p_Var10->field_0x95 & 1) == 0)) ||
               (bVar12 || p_Var10->utf8 == '\0')) goto LAB_00123a0e;
            _lws_log(8,"FINAL utf8 error\n");
            buf_01 = "partial utf8";
            sStack_50 = 0xc;
          }
          else {
            buf_01 = "bad utf8";
            sStack_50 = 8;
          }
          lws_close_reason(wsi,LWS_CLOSE_STATUS_INVALID_PAYLOAD,(uchar *)buf_01,sStack_50);
          _lws_log(8,"utf8 error\n");
          lwsl_hexdump_level(8,buf_00,len_00);
          uVar6 = 0xffffffff;
        }
        else {
LAB_00123a0e:
          callback_function = wsi->protocol->callback;
          if ((callback_function != (lws_callback_function *)0x0) && (wsi->wsistate_pre_close == 0))
          {
            iVar4 = user_callback_handle_rxflow
                              (callback_function,wsi,LWS_CALLBACK_RECEIVE,wsi->user_space,buf_00,
                               len_00);
            uVar6 = 0xffffffff;
            if (iVar4 != 0) goto LAB_00123a36;
            p_Var10 = wsi->ws;
          }
          p_Var10->field_0x96 = p_Var10->field_0x96 & 0xbf;
          uVar6 = uVar11;
        }
      }
LAB_00123a36:
      iVar4 = (int)*buf - (int)buf_00;
      if ((int)(uint)len < iVar4) {
        __assert_fail("(int)lws_ptr_diff(*buf, bin) <= (int)len",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/ws/server-ws.c"
                      ,0x3ce,"int lws_parse_ws(struct lws *, unsigned char **, size_t)");
      }
      len = len - (long)iVar4;
      if (uVar6 == 0) goto LAB_00123ae0;
      bVar12 = false;
      if ((int)uVar6 < 0) {
        _lws_log(8,"%s: rest_is_payload bailed\n","lws_parse_ws");
        return -1;
      }
    }
    if (bVar12) {
      puVar2 = *buf;
      *buf = puVar2 + 1;
      uVar9 = 0;
      iVar4 = lws_ws_rx_sm(wsi,'\0',*puVar2);
      len = len - 1;
    }
    else {
LAB_00123ae0:
      iVar4 = lws_ws_rx_sm(wsi,'\x03','\0');
      uVar9 = 1;
    }
    if (iVar4 < 0) {
      _lws_log(8,"%s: lws_ws_rx_sm bailed %d\n","lws_parse_ws",uVar9);
      return -1;
    }
  } while( true );
}

Assistant:

int
lws_parse_ws(struct lws *wsi, unsigned char **buf, size_t len)
{
	unsigned char *bufin = *buf;
	int m, bulk = 0;

	lwsl_debug("%s: received %d byte packet\n", __func__, (int)len);

	//lwsl_hexdump_notice(*buf, len);

	/* let the rx protocol state machine have as much as it needs */

	while (len) {
		/*
		 * we were accepting input but now we stopped doing so
		 */
		if (wsi->rxflow_bitmap) {
			lwsl_info("%s: doing rxflow, caching %d\n", __func__,
				(int)len);
			/*
			 * Since we cached the remaining available input, we
			 * can say we "consumed" it.
			 *
			 * But what about the case where the available input
			 * came out of the rxflow cache already?  If we are
			 * effectively "putting it back in the cache", we have
			 * leave it where it is, already pointed to by the head.
			 */
			if (lws_rxflow_cache(wsi, *buf, 0, (int)len) ==
							LWSRXFC_TRIMMED) {
				/*
				 * We dealt with it by trimming the existing
				 * rxflow cache HEAD to account for what we used.
				 *
				 * indicate we didn't use anything to the caller
				 * so he doesn't do any consumed processing
				 */
				lwsl_info("%s: trimming inside rxflow cache\n",
					  __func__);
				*buf = bufin;
			} else
				*buf += len;

			return 1;
		}
#if !defined(LWS_WITHOUT_EXTENSIONS)
		if (wsi->ws->rx_draining_ext) {
			lwsl_debug("%s: draining rx ext\n", __func__);
			m = lws_ws_rx_sm(wsi, ALREADY_PROCESSED_IGNORE_CHAR, 0);
			if (m < 0)
				return -1;
			continue;
		}
#endif

		/* consume payload bytes efficiently */
		while (wsi->lws_rx_parse_state == LWS_RXPS_WS_FRAME_PAYLOAD &&
				(wsi->ws->opcode == LWSWSOPC_TEXT_FRAME ||
				 wsi->ws->opcode == LWSWSOPC_BINARY_FRAME ||
				 wsi->ws->opcode == LWSWSOPC_CONTINUATION) &&
		       len) {
			uint8_t *bin = *buf;

			bulk = 1;
			m = lws_ws_frame_rest_is_payload(wsi, buf, len);
			assert((int)lws_ptr_diff(*buf, bin) <= (int)len);
			len -= lws_ptr_diff(*buf, bin);

			if (!m) {

				break;
			}
			if (m < 0) {
				lwsl_info("%s: rest_is_payload bailed\n",
					  __func__);
				return -1;
			}
		}

		if (!bulk) {
			/* process the byte */
			m = lws_ws_rx_sm(wsi, 0, *(*buf)++);
			len--;
		} else {
			/*
			 * We already handled this byte in bulk, just deal
			 * with the ramifications
			 */
#if !defined(LWS_WITHOUT_EXTENSIONS)
			lwsl_debug("%s: coming out of bulk with len %d, "
				   "wsi->ws->rx_draining_ext %d\n",
				   __func__, (int)len,
				   wsi->ws->rx_draining_ext);
#endif
			m = lws_ws_rx_sm(wsi, ALREADY_PROCESSED_IGNORE_CHAR |
					      ALREADY_PROCESSED_NO_CB, 0);
		}

		if (m < 0) {
			lwsl_info("%s: lws_ws_rx_sm bailed %d\n", __func__,
				  bulk);

			return -1;
		}

		bulk = 0;
	}

	lwsl_debug("%s: exit with %d unused\n", __func__, (int)len);

	return 0;
}